

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall p2t::Sweep::FillAdvancingFront(Sweep *this,SweepContext *tcx,Node *n)

{
  Node *pNVar1;
  bool bVar2;
  Node **ppNVar3;
  Sweep *this_00;
  double dVar4;
  
  ppNVar3 = &n->next;
  this_00 = this;
  while (pNVar1 = *ppNVar3, pNVar1->next != (Node *)0x0) {
    this_00 = this;
    bVar2 = LargeHole_DontFill(this,pNVar1);
    if (bVar2) break;
    this_00 = this;
    Fill(this,tcx,pNVar1);
    ppNVar3 = &pNVar1->next;
  }
  ppNVar3 = &n->prev;
  while (pNVar1 = *ppNVar3, pNVar1->prev != (Node *)0x0) {
    this_00 = this;
    bVar2 = LargeHole_DontFill(this,pNVar1);
    if (bVar2) break;
    this_00 = this;
    Fill(this,tcx,pNVar1);
    ppNVar3 = &pNVar1->prev;
  }
  pNVar1 = n->next;
  if ((pNVar1 != (Node *)0x0) && (pNVar1->next != (Node *)0x0)) {
    dVar4 = BasinAngle(this_00,n);
    if (dVar4 < 2.356194490192345) {
      FillBasin(this,tcx,n);
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillAdvancingFront(SweepContext& tcx, Node& n)
{

  // Fill right holes
  Node* node = n.next;

  while (node->next) {
    // if HoleAngle exceeds 90 degrees then break.
    if (LargeHole_DontFill(node)) break;
    Fill(tcx, *node);
    node = node->next;
  }

  // Fill left holes
  node = n.prev;

  while (node->prev) {
    // if HoleAngle exceeds 90 degrees then break.
    if (LargeHole_DontFill(node)) break;
    Fill(tcx, *node);
    node = node->prev;
  }

  // Fill right basins
  if (n.next && n.next->next) {
    const double angle = BasinAngle(n);
    if (angle < PI_3div4) {
      FillBasin(tcx, n);
    }
  }
}